

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O0

SinkResultType __thiscall
duckdb::PhysicalBatchCopyToFile::Sink
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  bool bVar1;
  SinkResultType SVar2;
  PhysicalBatchCopyToFile *op;
  idx_t iVar3;
  string *msg;
  ClientContext *in_RCX;
  FixedBatchCopyGlobalState *in_RDX;
  undefined8 in_RSI;
  ClientContext *in_RDI;
  DataChunk *in_stack_00000020;
  ColumnDataAppendState *in_stack_00000028;
  ColumnDataCollection *in_stack_00000030;
  ClientContext *in_stack_00000038;
  PhysicalBatchCopyToFile *in_stack_00000040;
  idx_t new_memory_usage;
  unique_lock<std::mutex> guard;
  idx_t batch_index;
  BatchMemoryManager *memory_manager;
  FixedBatchCopyGlobalState *gstate;
  FixedBatchCopyLocalState *state;
  StateWithBlockableTasks *in_stack_ffffffffffffff38;
  BatchMemoryManager *in_stack_ffffffffffffff40;
  allocator *this_00;
  ClientContext *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  SinkResultType in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  allocator in_stack_ffffffffffffff67;
  string local_98 [8];
  idx_t in_stack_ffffffffffffff70;
  BatchMemoryManager *in_stack_ffffffffffffff78;
  BatchMemoryManager *in_stack_ffffffffffffff80;
  undefined8 local_70;
  SinkResultType local_1;
  
  op = (PhysicalBatchCopyToFile *)
       LocalSinkState::Cast<duckdb::FixedBatchCopyLocalState>
                 ((LocalSinkState *)in_stack_ffffffffffffff40);
  GlobalSinkState::Cast<duckdb::FixedBatchCopyGlobalState>
            ((GlobalSinkState *)in_stack_ffffffffffffff40);
  optional_idx::GetIndex((optional_idx *)in_stack_ffffffffffffff80);
  if ((char)(op->function).super_Function.extra_info._M_string_length == '\x02') {
    ExecuteTasks((PhysicalBatchCopyToFile *)
                 CONCAT17(in_stack_ffffffffffffff57,
                          CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                 in_stack_ffffffffffffff48,(GlobalSinkState *)in_stack_ffffffffffffff40);
    FlushBatchData(in_stack_00000040,in_stack_00000038,(GlobalSinkState *)in_stack_00000030);
    bVar1 = BatchMemoryManager::IsMinimumBatchIndex
                      (in_stack_ffffffffffffff40,(idx_t)in_stack_ffffffffffffff38);
    if ((!bVar1) &&
       (bVar1 = BatchMemoryManager::OutOfMemory(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
       , bVar1)) {
      StateWithBlockableTasks::Lock(in_stack_ffffffffffffff38);
      bVar1 = BatchMemoryManager::IsMinimumBatchIndex
                        (in_stack_ffffffffffffff40,(idx_t)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff57 = bVar1;
      if (!bVar1) {
        in_stack_ffffffffffffff56 =
             StateWithBlockableTasks::BlockSink
                       ((StateWithBlockableTasks *)
                        CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)
                                ),(unique_lock<std::mutex> *)in_stack_ffffffffffffff48,
                        (InterruptState *)in_stack_ffffffffffffff40);
        local_1 = in_stack_ffffffffffffff56;
      }
      ::std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      if (!bVar1) {
        return local_1;
      }
    }
    *(undefined1 *)&(op->function).super_Function.extra_info._M_string_length = 1;
  }
  bVar1 = BatchMemoryManager::IsMinimumBatchIndex
                    (in_stack_ffffffffffffff40,(idx_t)in_stack_ffffffffffffff38);
  if (!bVar1) {
    optional_idx::GetIndex((optional_idx *)in_stack_ffffffffffffff80);
    BatchMemoryManager::UpdateMinBatchIndex
              (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
    bVar1 = BatchMemoryManager::OutOfMemory(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (bVar1) {
      *(undefined1 *)&(op->function).super_Function.extra_info._M_string_length = 2;
      SVar2 = (**(code **)&(((in_RDI->super_enable_shared_from_this<duckdb::ClientContext>).
                             __weak_this_.internal.
                             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->config).preserve_identifier_case)(in_RDI,in_RSI,in_RDX,in_RCX);
      return SVar2;
    }
  }
  if ((in_RDI[1].config.field_0x92 & 1) == 0) {
    FixedBatchCopyGlobalState::Initialize(in_RDX,in_RCX,op);
  }
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                      *)0x185eb31);
  if (!bVar1) {
    FixedBatchCopyLocalState::InitializeCollection
              ((FixedBatchCopyLocalState *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),in_RDI,
               (PhysicalOperator *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
    optional_idx::optional_idx
              ((optional_idx *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
    *(undefined8 *)&(op->function).super_Function.extra_info = local_70;
  }
  iVar3 = DataChunk::size((DataChunk *)in_RDX);
  (op->function).super_Function.name.field_2._M_allocated_capacity =
       iVar3 + (op->function).super_Function.name.field_2._M_allocated_capacity;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)in_stack_ffffffffffffff40);
  ColumnDataCollection::Append(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)in_stack_ffffffffffffff40);
  iVar3 = ColumnDataCollection::AllocationSize
                    ((ColumnDataCollection *)
                     CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
  if (*(ulong *)((long)&(op->function).super_Function.name.field_2 + 8) < iVar3) {
    BatchMemoryManager::IncreaseUnflushedMemory
              (in_stack_ffffffffffffff40,(idx_t)in_stack_ffffffffffffff38);
    *(idx_t *)((long)&(op->function).super_Function.name.field_2 + 8) = iVar3;
  }
  else if (iVar3 < *(ulong *)((long)&(op->function).super_Function.name.field_2 + 8)) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = (allocator *)&stack0xffffffffffffff67;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_98,"PhysicalFixedBatchCopy - memory usage decreased somehow?",this_00);
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalBatchCopyToFile::Sink(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSinkInput &input) const {
	auto &state = input.local_state.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;
	auto batch_index = state.partition_info.batch_index.GetIndex();
	if (state.current_task == FixedBatchCopyState::PROCESSING_TASKS) {
		ExecuteTasks(context.client, gstate);
		FlushBatchData(context.client, gstate);

		if (!memory_manager.IsMinimumBatchIndex(batch_index) && memory_manager.OutOfMemory(batch_index)) {
			auto guard = memory_manager.Lock();
			if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
				// no tasks to process, we are not the minimum batch index and we have no memory available to buffer
				// block the task for now
				return memory_manager.BlockSink(guard, input.interrupt_state);
			}
		}
		state.current_task = FixedBatchCopyState::SINKING_DATA;
	}
	if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
		memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());

		// we are not processing the current min batch index
		// check if we have exceeded the maximum number of unflushed rows
		if (memory_manager.OutOfMemory(batch_index)) {
			// out-of-memory - stop sinking chunks and instead assist in processing tasks for the minimum batch index
			state.current_task = FixedBatchCopyState::PROCESSING_TASKS;
			return Sink(context, chunk, input);
		}
	}
	if (!write_empty_file) {
		// if we are not writing empty files - initialize after we have received rows
		gstate.Initialize(context.client, *this);
	}
	if (!state.collection) {
		state.InitializeCollection(context.client, *this);
		state.batch_index = batch_index;
	}
	state.rows_copied += chunk.size();
	state.collection->Append(state.append_state, chunk);
	auto new_memory_usage = state.collection->AllocationSize();
	if (new_memory_usage > state.local_memory_usage) {
		// memory usage increased - add to global state
		memory_manager.IncreaseUnflushedMemory(new_memory_usage - state.local_memory_usage);
		state.local_memory_usage = new_memory_usage;
	} else if (new_memory_usage < state.local_memory_usage) {
		throw InternalException("PhysicalFixedBatchCopy - memory usage decreased somehow?");
	}
	return SinkResultType::NEED_MORE_INPUT;
}